

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

void mp_dump(FILE *fp,char *prefix,mp_int *x,char *suffix)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  
  fprintf((FILE *)fp,"%s0x",prefix);
  uVar2 = x->nw * 8;
  if (uVar2 != 0) {
    bVar3 = 0;
    do {
      uVar2 = uVar2 - 1;
      bVar3 = bVar3 - 8;
      if (uVar2 >> 3 < x->nw) {
        uVar1 = x->w[uVar2 >> 3];
      }
      else {
        uVar1 = 0;
      }
      fprintf((FILE *)fp,"%02X",uVar1 >> (bVar3 & 0x38) & 0xff);
    } while (uVar2 != 0);
  }
  fputs(suffix,(FILE *)fp);
  return;
}

Assistant:

void mp_dump(FILE *fp, const char *prefix, mp_int *x, const char *suffix)
{
    fprintf(fp, "%s0x", prefix);
    for (size_t i = mp_max_bytes(x); i-- > 0 ;)
        fprintf(fp, "%02X", mp_get_byte(x, i));
    fputs(suffix, fp);
}